

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

obj * getobj(char *let,char *word,obj **ostack)

{
  char cVar1;
  ushort uVar2;
  uint uVar3;
  bool bVar4;
  long lVar5;
  char cVar6;
  int iVar7;
  obj_use_status oVar8;
  int iVar9;
  uint uVar10;
  char *pcVar11;
  ulong uVar12;
  obj *poVar13;
  long *out_cnt;
  byte bVar14;
  char *pcVar15;
  ulong uVar16;
  uint *count;
  obj **otmp;
  bool bVar17;
  int cnt;
  long ctmp;
  char buf [256];
  char altlets [256];
  char lets [256];
  char qbuf [128];
  uint local_3e8;
  undefined4 local_3e4;
  char *local_3e0;
  char *local_3d8;
  long local_3d0;
  obj **local_3c8;
  ulong local_3c0;
  char local_3b8 [256];
  char local_2b8 [256];
  char local_1b8 [256];
  char local_b8 [136];
  
  uVar16 = (ulong)(*let == '\x13');
  uVar12 = (ulong)(let[uVar16] == '\x14');
  lVar5 = uVar12 + uVar16;
  cVar1 = let[uVar12 + uVar16];
  cVar6 = let[(ulong)(cVar1 == '\x15') + lVar5];
  local_3d8 = let + (ulong)(cVar6 == '\x16') + (ulong)(cVar1 == '\x15') + lVar5;
  local_3c8 = ostack;
  if (let[uVar16] == '\x14') {
    iVar7 = strcmp(word,"read");
    local_3e4 = CONCAT31((int3)((uint)iVar7 >> 8),iVar7 != 0);
  }
  else {
    local_3e4 = 0;
  }
  bVar17 = true;
  if ((*local_3d8 == '\x02') && (iVar7 = strcmp(word,"throw"), iVar7 == 0)) {
    bVar17 = ((youmonst.data)->mflags2 & 0x8000000) == 0;
  }
  local_3c0 = (ulong)(cVar6 == '\x16') ^ 0x2d;
  if (cVar1 == '\x15') {
    pcVar15 = local_3b8 + 2;
    local_3b8[0] = (char)local_3c0;
    local_3b8[1] = 0x20;
  }
  else {
    pcVar15 = local_3b8;
  }
  if (invent == (obj *)0x0) {
    pcVar11 = "";
    iVar7 = 0;
    local_3e0 = local_2b8;
  }
  else {
    local_3e0 = local_2b8;
    cVar6 = '\0';
    iVar7 = 0;
    poVar13 = invent;
    do {
      if (((*local_3d8 == '\0') ||
          (pcVar11 = strchr(local_3d8,(int)poVar13->oclass), pcVar11 != (char *)0x0)) ||
         ((!bVar17 && (poVar13->otyp == 0x214)))) {
        pcVar15[iVar7] = poVar13->invlet;
        oVar8 = object_selection_checks(poVar13,word);
        if (oVar8 - ALREADY_IN_USE < 2) {
          cVar6 = cVar6 + '\x01';
        }
        else if (oVar8 != UNSUITABLE_USE) {
          if (oVar8 == CURRENTLY_NOT_USABLE) {
            uVar12 = 0;
            *local_3e0 = poVar13->invlet;
            local_3e0 = local_3e0 + 1;
            goto LAB_001b0233;
          }
          iVar7 = iVar7 + 1;
        }
      }
      else {
        iVar9 = strcmp(word,"read");
        if (iVar9 == 0) {
          uVar2 = poVar13->otyp;
          uVar12 = (ulong)uVar2;
          if (uVar2 < 0xf5) {
            if (((uVar2 != 0xc) && (uVar2 != 0x7b)) && (uVar2 != 0xe4)) goto LAB_001b02b1;
          }
          else if ((0x34 < uVar2 - 0xf5) ||
                  ((0x10300000000005U >> ((ulong)(uVar2 - 0xf5) & 0x3f) & 1) == 0)) {
LAB_001b02b1:
            if (poVar13->oartifact != '#') {
              if (obj_descr[objects[(short)uVar2].oc_descr_idx].oc_descr != (char *)0x0) {
                uVar10 = strncmp(obj_descr[objects[(short)uVar2].oc_descr_idx].oc_descr,"runed",5);
                uVar12 = (ulong)uVar10;
                if (uVar10 == 0) goto LAB_001b0233;
              }
              goto LAB_001b0291;
            }
          }
LAB_001b0233:
          local_3e4 = (undefined4)CONCAT71((int7)(uVar12 >> 8),1);
        }
      }
LAB_001b0291:
      poVar13 = poVar13->nobj;
    } while (poVar13 != (obj *)0x0);
    pcVar11 = "else ";
    if (cVar6 == '\0') {
      pcVar11 = "";
    }
  }
  pcVar15[iVar7] = '\0';
  if (local_3b8 < pcVar15 && iVar7 == 0) {
    if (pcVar15[-1] == ' ') {
      pcVar15 = pcVar15 + -1;
      *pcVar15 = '\0';
    }
    strcpy(local_1b8,pcVar15);
  }
  else {
    strcpy(local_1b8,pcVar15);
    if (5 < iVar7) {
      compactify(pcVar15);
      *local_3e0 = '\0';
      goto LAB_001b03dd;
    }
  }
  *local_3e0 = '\0';
  if (((cVar1 != '\x15') && (iVar7 == 0)) && ((char)local_3e4 == '\0')) {
    pline("You don\'t have anything %sto %s.",pcVar11,word);
    return (obj *)0x0;
  }
LAB_001b03dd:
  local_3e0 = (char *)CONCAT71(local_3e0._1_7_,'$');
  bVar17 = false;
LAB_001b03f1:
  local_3e8 = 0;
  bVar14 = (byte)uVar16;
  if ((byte)uVar16 == 2) {
    bVar14 = 1;
  }
  check_tutorial_message(0x10b);
  if (local_3b8[0] == '\0') {
    sprintf(local_b8,"What do you want to %s? [*]",word);
  }
  else {
    sprintf(local_b8,"What do you want to %s? [%s or ?*]",word,local_3b8);
  }
  count = &local_3e8;
  if (bVar14 == 0) {
    count = (uint *)0x0;
  }
  cVar6 = query_key(local_b8,(int *)count);
  uVar10 = (uint)bVar14;
  if (local_3e8 != 0xffffffff) {
    uVar10 = 2;
  }
  bVar4 = bVar17;
  if (local_3e8 == 0) {
    bVar4 = true;
  }
  if (bVar14 != 1) {
    uVar10 = (uint)bVar14;
  }
  uVar16 = (ulong)uVar10;
  if (bVar14 != 1) {
    bVar4 = bVar17;
  }
  if (local_3e8 == 0xffffffff) {
    local_3e8 = 0;
  }
  uVar3 = local_3e8;
  pcVar15 = strchr(" \r\n\x1b",(int)cVar6);
  if (pcVar15 != (char *)0x0) {
    if (flags.verbose == '\0') {
      return (obj *)0x0;
    }
    pcVar15 = "Never mind.";
LAB_001b068f:
    pline(pcVar15);
    return (obj *)0x0;
  }
  if (cVar6 == (char)local_3c0) {
    if (cVar1 != '\x15') {
      return (obj *)0x0;
    }
    return &zeroobj;
  }
  if (cVar6 == (char)local_3e0) {
    if ((uVar3 == 0) && (bVar4)) {
      return (obj *)0x0;
    }
    if ((int)uVar3 < 0) {
      pcVar15 = "The LRS would be very interested to know you have that much.";
      goto LAB_001b068f;
    }
  }
  if ((cVar6 == '?') || (cVar6 == '*')) goto LAB_001b0502;
  goto LAB_001b05a1;
LAB_001b0502:
  pcVar15 = (char *)0x0;
  if (cVar6 == '?') {
    pcVar15 = local_1b8;
  }
  pcVar11 = pcVar15;
  if (local_2b8[0] != '\0') {
    pcVar11 = local_2b8;
  }
  if (local_1b8[0] != '\0') {
    pcVar11 = pcVar15;
  }
  local_3d0 = 0;
  if (cVar6 != '?') {
    pcVar11 = pcVar15;
  }
  out_cnt = (long *)0x0;
  if ((char)uVar10 != '\0') {
    out_cnt = &local_3d0;
  }
  cVar6 = display_pickinv(pcVar11,'\x01',out_cnt);
  bVar17 = bVar4;
  if (cVar6 != '\0') {
    if (-1 < local_3d0 && (char)uVar10 != '\0') {
      local_3e8 = (uint)local_3d0;
      if (local_3e8 == 0) {
        bVar4 = true;
      }
      uVar16 = 2;
    }
    if (cVar6 == '\x1b') {
      if (flags.verbose == '\0') {
        return (obj *)0x0;
      }
      pline("Never mind.");
      return (obj *)0x0;
    }
LAB_001b05a1:
    bVar17 = bVar4;
    if ((char)uVar16 == '\x02') {
      iVar7 = strcmp(word,"throw");
      uVar16 = 2;
      if (iVar7 == 0) {
        if ((local_3e8 == 0) && (bVar4)) {
          return (obj *)0x0;
        }
        uVar16 = (ulong)(byte)((cVar6 == (char)local_3e0) + 1);
        if (1 < (int)local_3e8) {
          pline("You can only throw one item at a time.");
          goto LAB_001b03f1;
        }
      }
    }
    uVar10 = local_3e8;
    iflags.botl = '\x01';
    otmp = &invent;
    do {
      otmp = &((obj *)otmp)->nobj->nobj;
      if ((obj *)otmp == (obj *)0x0) {
        pline("You don\'t have that object.");
        goto LAB_001b03f1;
      }
    } while (((obj *)otmp)->invlet != cVar6);
    uVar3 = ((obj *)otmp)->quan;
    if ((int)local_3e8 <= (int)uVar3 && -1 < (int)local_3e8) {
      if (((char)local_3e4 == '\0') &&
         (pcVar15 = strchr(local_3d8,(int)((obj *)otmp)->oclass), pcVar15 == (char *)0x0)) {
        silly_thing(word,(obj *)otmp);
      }
      else {
        if ((char)uVar16 != '\x02') {
          return (obj *)otmp;
        }
        if (uVar10 != 0) {
          if (uVar10 == uVar3) {
            return (obj *)otmp;
          }
          if ((((obj *)otmp)->otyp == 0x210) && ((((obj *)otmp)->field_0x4a & 1) != 0)) {
            ((obj *)otmp)->corpsenm = uVar10;
            return (obj *)otmp;
          }
          iVar7 = welded((obj *)otmp);
          if (iVar7 == 0) {
            if (local_3c8 != (obj **)0x0) {
              *local_3c8 = (obj *)otmp;
            }
            poVar13 = splitobj((obj *)otmp,(long)(int)local_3e8);
            return poVar13;
          }
          return (obj *)otmp;
        }
      }
      return (obj *)0x0;
    }
    pline("You don\'t have that many!  You have only %ld.",(ulong)uVar3);
  }
  goto LAB_001b03f1;
}

Assistant:

struct obj *getobj(const char *let, const char *word, struct obj **ostack)
{
	struct obj *otmp;
	char ilet;
	char buf[BUFSZ], qbuf[QBUFSZ];
	char lets[BUFSZ], altlets[BUFSZ], *ap;
	int foo = 0;
	char *bp = buf;
	xchar allowcnt = 0;	/* 0, 1 or 2 */
	boolean allowall = FALSE;
	boolean allownone = FALSE;
	char nonechar = '-';
	boolean useboulder = FALSE;
	xchar foox = 0;
	int cnt;
	boolean prezero = FALSE;

	if (*let == ALLOW_COUNT) let++, allowcnt = 1;
	if (*let == ALL_CLASSES) let++, allowall = TRUE;
	if (*let == ALLOW_NONE) let++, allownone = TRUE;
	if (*let == NONE_ON_COMMA) let++, nonechar = ',';
	/* "ugly check" for reading fortune cookies, part 1 */
	/* The normal 'ugly check' keeps the object on the inventory list.
	 * We don't want to do that for shirts/cookies, so the check for
	 * them is handled a bit differently (and also requires that we set
	 * allowall in the caller)
	 */
	if (allowall && !strcmp(word, "read")) allowall = FALSE;

	/* another ugly check: show boulders (not statues) */
	if (*let == WEAPON_CLASS &&
	   !strcmp(word, "throw") && throws_rocks(youmonst.data))
	    useboulder = TRUE;

	if (allownone) *bp++ = nonechar;
	if (bp > buf && bp[-1] == nonechar) *bp++ = ' ';
	ap = altlets;

	ilet = 'a';
	for (otmp = invent; otmp; otmp = otmp->nobj) {
	    if (!*let || strchr(let, otmp->oclass)
		|| (useboulder && otmp->otyp == BOULDER)) {
		bp[foo++] = otmp->invlet;
		
		switch (object_selection_checks(otmp, word)) {
		    case ALREADY_IN_USE: /* eg: wield the weapon in your hands */
		    case ARMOR_TAKEOFF_BLOCKED:
			foo--;
			foox++;
			break;
			
		    case UNSUITABLE_USE: /* eg: putting on a tool */
			foo--;
			break;
		    
		    case CURRENTLY_NOT_USABLE:
			foo--;
			allowall = TRUE;
			*ap++ = otmp->invlet;
			break;
			
		    default: break;
		}

	    } else {

		/* "ugly check" for reading fortune cookies, part 2 */
		if (!strcmp(word, "read") &&
		    (otmp->otyp == FORTUNE_COOKIE ||
		     otmp->otyp == T_SHIRT ||
		     otmp->otyp == TIN ||
		     otmp->otyp == CAN_OF_GREASE ||
		     otmp->otyp == CANDY_BAR ||
		     otmp->otyp == CREDIT_CARD ||
		     otmp->otyp == MAGIC_MARKER ||
		     otmp->otyp == COIN_CLASS ||
		     otmp->oartifact == ART_ORB_OF_FATE ||
		     (OBJ_DESCR(objects[otmp->otyp]) &&
		      !strncmp(OBJ_DESCR(objects[otmp->otyp]), "runed", 5))))
			allowall = TRUE;
	    }

	    if (ilet == 'z') ilet = 'A'; else ilet++;
	}
	bp[foo] = 0;
	if (foo == 0 && bp > buf && bp[-1] == ' ') *--bp = 0;
	strcpy(lets, bp);	/* necessary since we destroy buf */
	if (foo > 5)			/* compactify string */
		compactify(bp);
	*ap = '\0';

	if (!foo && !allowall && !allownone) {
		pline("You don't have anything %sto %s.",
			foox ? "else " : "", word);
		return NULL;
	}
	for (;;) {
		cnt = 0;
		if (allowcnt == 2)
		    allowcnt = 1;  /* abort previous count */
		check_tutorial_message(QT_T_CHOOSEITEM);
		if (!buf[0]) {
			sprintf(qbuf, "What do you want to %s? [*]", word);
		} else {
			sprintf(qbuf, "What do you want to %s? [%s or ?*]",
				word, buf);
		}
		ilet = query_key(qbuf, allowcnt ? &cnt : NULL);
		if (allowcnt == 1 && cnt != -1) {
		    allowcnt = 2; /* signal presence of cnt */
		    if (cnt == 0)
			prezero = TRUE; /* cnt was explicitly set to 0 */
		}
		if (cnt == -1)
		    cnt = 0;
		
		if (strchr(quitchars,ilet)) {
		    if (flags.verbose)
			pline("Never mind.");
		    return NULL;
		}
		if (ilet == nonechar) {
			return allownone ? &zeroobj : NULL;
		}
		if (ilet == def_oc_syms[COIN_CLASS]) {
			if (cnt == 0 && prezero) return NULL;
			/* Historic note: early Nethack had a bug which was
			 * first reported for Larn, where trying to drop 2^32-n
			 * gold pieces was allowed, and did interesting things
			 * to your money supply.  The LRS is the tax bureau
			 * from Larn.
			 */
			if (cnt < 0) {
	pline("The LRS would be very interested to know you have that much.");
				return NULL;
			}
		}
		if (ilet == '?' || ilet == '*') {
		    char *allowed_choices = (ilet == '?') ? lets : NULL;
		    long ctmp = 0;

		    if (ilet == '?' && !*lets && *altlets)
			allowed_choices = altlets;
		    ilet = display_pickinv(allowed_choices, TRUE,
					   allowcnt ? &ctmp : NULL);
		    if (!ilet) continue;
		    if (allowcnt && ctmp >= 0) {
			cnt = ctmp;
			if (!cnt) prezero = TRUE;
			allowcnt = 2;
		    }
		    if (ilet == '\033') {
			if (flags.verbose)
			    pline("Never mind.");
			return NULL;
		    }
		    /* they typed a letter (not a space) at the prompt */
		}
		if (allowcnt == 2 && !strcmp(word,"throw")) {
		    /* permit counts for throwing gold, but don't accept
		     * counts for other things since the throw code will
		     * split off a single item anyway */
		    if (ilet != def_oc_syms[COIN_CLASS])
			allowcnt = 1;
		    if (cnt == 0 && prezero) return NULL;
		    if (cnt > 1) {
			pline("You can only throw one item at a time.");
			continue;
		    }
		}
		iflags.botl = 1; /* May have changed the amount of money */

		for (otmp = invent; otmp; otmp = otmp->nobj)
			if (otmp->invlet == ilet) break;
		if (!otmp) {
			pline("You don't have that object.");
			continue;
		} else if (cnt < 0 || otmp->quan < cnt) {
			pline("You don't have that many!  You have only %ld.",
			    otmp->quan);
			continue;
		}
		break;
	}
	if (!allowall && let && !strchr(let,otmp->oclass)) {
		silly_thing(word, otmp);
		return NULL;
	}
	if (allowcnt == 2) {	/* cnt given */
	    if (cnt == 0) return NULL;
	    if (cnt != otmp->quan) {
		/* don't split a stack of cursed loadstones */
		if (otmp->otyp == LOADSTONE && otmp->cursed) {
		    /* kludge for canletgo()'s can't-drop-this message */
		    otmp->corpsenm = (int) cnt;
		} else if (welded(otmp)) {
		    /* don't split a stack of wielded, cursed weapons */
		} else {
		    if (ostack) *ostack = otmp;
		    otmp = splitobj(otmp, cnt);
		}
	    }
	}
	return otmp;
}